

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O2

bool __thiscall
Js::DebugDocument::FindBPStatementLocation
          (DebugDocument *this,UINT bpId,StatementLocation *statement)

{
  uint uVar1;
  BreakpointProbeList *pBVar2;
  BreakpointProbe *this_00;
  ulong uVar3;
  ulong uVar4;
  
  pBVar2 = this->m_breakpointList;
  uVar3 = 0;
  if (pBVar2 != (BreakpointProbeList *)0x0) {
    uVar1 = (pBVar2->
            super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      this_00 = (pBVar2->
                super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                buffer[uVar3];
      if ((this_00 != (BreakpointProbe *)0x0) && (this_00->breakpointId == bpId)) {
        BreakpointProbe::GetStatementLocation(this_00,statement);
        uVar3 = 1;
        goto LAB_007e1f0c;
      }
    }
    uVar3 = 0;
  }
LAB_007e1f0c:
  return SUB81(uVar3,0);
}

Assistant:

bool DebugDocument::FindBPStatementLocation(UINT bpId, StatementLocation * statement)
    {
        bool foundStatement = false;
        if (m_breakpointList != nullptr)
        {
            m_breakpointList->MapUntil([&](int index, BreakpointProbe* bpProbe) -> bool
            {
                if (bpProbe != nullptr && bpProbe->GetId() == bpId)
                {
                    bpProbe->GetStatementLocation(statement);
                    foundStatement = true;
                    return true;
                }
                return false;
            });
        }
        return foundStatement;
    }